

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O0

void __thiscall
QTriangulator<unsigned_short>::MonotoneToTriangles::decompose(MonotoneToTriangles *this)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  qsizetype qVar4;
  const_reference puVar5;
  int *piVar6;
  MonotoneToTriangles *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int i;
  int count;
  bool clockwiseOrder;
  bool stackIsOnLeftSide;
  int right;
  int left;
  int minimum;
  QDataBuffer<int> stack;
  QList<unsigned_short> result;
  int *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  long in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  uint in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int local_60;
  int local_5c;
  int local_58;
  bool local_51;
  int local_44;
  int local_40;
  int local_3c;
  QDataBuffer<int> local_38;
  QList<unsigned_short> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (unsigned_short *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<unsigned_short>::QList((QList<unsigned_short> *)0x686145);
  local_38.capacity = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.siz = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.buffer = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QList<unsigned_short>::size(&in_RDI->m_parent->m_indices);
  QDataBuffer<int>::QDataBuffer
            ((QDataBuffer<int> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (qsizetype)in_stack_ffffffffffffff48);
  in_RDI->m_first = 0;
  while (iVar1 = in_RDI->m_first, qVar4 = QList<unsigned_short>::size(&in_RDI->m_parent->m_indices),
        iVar1 + 3 <= qVar4) {
    in_RDI->m_length = 0;
    while (puVar5 = QList<unsigned_short>::at
                              ((QList<unsigned_short> *)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               (qsizetype)in_stack_ffffffffffffff48), *puVar5 != 0xffff) {
      in_RDI->m_length = in_RDI->m_length + 1;
    }
    if (in_RDI->m_length < 3) {
      in_RDI->m_first = in_RDI->m_length + 1 + in_RDI->m_first;
    }
    else {
      local_3c = 0;
      while( true ) {
        next(in_RDI,local_3c);
        bVar2 = less((MonotoneToTriangles *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68)
        ;
        if (!bVar2) break;
        local_3c = next(in_RDI,local_3c);
      }
      while( true ) {
        previous(in_RDI,local_3c);
        bVar2 = less((MonotoneToTriangles *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68)
        ;
        if (!bVar2) break;
        local_3c = previous(in_RDI,local_3c);
      }
      QDataBuffer<int>::reset(&local_38);
      QDataBuffer<int>::add
                ((QDataBuffer<int> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      local_40 = previous(in_RDI,local_3c);
      local_44 = next(in_RDI,local_3c);
      bVar2 = leftOfEdge((MonotoneToTriangles *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                         in_stack_ffffffffffffff74);
      local_51 = less((MonotoneToTriangles *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68
                     );
      if (local_51) {
        QDataBuffer<int>::add
                  ((QDataBuffer<int> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                   ,in_stack_ffffffffffffff48);
        local_40 = previous(in_RDI,local_40);
      }
      else {
        QDataBuffer<int>::add
                  ((QDataBuffer<int> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                   ,in_stack_ffffffffffffff48);
        local_44 = next(in_RDI,local_44);
      }
      for (local_58 = 0; local_58 + 2 < in_RDI->m_length; local_58 = local_58 + 1) {
        bVar3 = less((MonotoneToTriangles *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68)
        ;
        if (bVar3) {
          if (local_51 == false) {
            for (local_5c = 0; qVar4 = QDataBuffer<int>::size(&local_38), local_5c + 1 < qVar4;
                local_5c = local_5c + 1) {
              QDataBuffer<int>::at(&local_38,(long)(local_5c + 1));
              indices((MonotoneToTriangles *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              QList<unsigned_short>::push_back
                        ((QList<unsigned_short> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (parameter_type)((ulong)in_stack_ffffffffffffff48 >> 0x30));
              indices((MonotoneToTriangles *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              QList<unsigned_short>::push_back
                        ((QList<unsigned_short> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (parameter_type)((ulong)in_stack_ffffffffffffff48 >> 0x30));
              QDataBuffer<int>::at(&local_38,(long)local_5c);
              indices((MonotoneToTriangles *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              QList<unsigned_short>::push_back
                        ((QList<unsigned_short> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (parameter_type)((ulong)in_stack_ffffffffffffff48 >> 0x30));
            }
            piVar6 = QDataBuffer<int>::last(&local_38);
            in_stack_ffffffffffffff84 = *piVar6;
            piVar6 = QDataBuffer<int>::first(&local_38);
            *piVar6 = in_stack_ffffffffffffff84;
            QDataBuffer<int>::resize
                      ((QDataBuffer<int> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (qsizetype)in_stack_ffffffffffffff48);
          }
          else {
            while( true ) {
              qVar4 = QDataBuffer<int>::size(&local_38);
              in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 & 0xffffff;
              if (1 < qVar4) {
                in_stack_ffffffffffffff7c = (uint)bVar2;
                in_stack_ffffffffffffff74 = local_40;
                qVar4 = QDataBuffer<int>::size(&local_38);
                piVar6 = QDataBuffer<int>::at(&local_38,qVar4 + -2);
                in_stack_ffffffffffffff78 = *piVar6;
                QDataBuffer<int>::last(&local_38);
                bVar3 = leftOfEdge((MonotoneToTriangles *)
                                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                                   in_stack_ffffffffffffff74);
                in_stack_ffffffffffffff80 =
                     CONCAT13(in_stack_ffffffffffffff7c != ((bVar3 ^ 0xffU) & 1),
                              (int3)in_stack_ffffffffffffff80);
              }
              if ((char)(in_stack_ffffffffffffff80 >> 0x18) == '\0') break;
              qVar4 = QDataBuffer<int>::size(&local_38);
              QDataBuffer<int>::at(&local_38,qVar4 + -2);
              indices((MonotoneToTriangles *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              QList<unsigned_short>::push_back
                        ((QList<unsigned_short> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (parameter_type)((ulong)in_stack_ffffffffffffff48 >> 0x30));
              indices((MonotoneToTriangles *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              QList<unsigned_short>::push_back
                        ((QList<unsigned_short> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (parameter_type)((ulong)in_stack_ffffffffffffff48 >> 0x30));
              QDataBuffer<int>::last(&local_38);
              indices((MonotoneToTriangles *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              QList<unsigned_short>::push_back
                        ((QList<unsigned_short> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (parameter_type)((ulong)in_stack_ffffffffffffff48 >> 0x30));
              QDataBuffer<int>::pop_back(&local_38);
            }
          }
          QDataBuffer<int>::add
                    ((QDataBuffer<int> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48);
          local_40 = previous(in_RDI,local_40);
          local_51 = true;
        }
        else {
          if (local_51 == true) {
            local_60 = 0;
            while( true ) {
              in_stack_ffffffffffffff68 = (long)(local_60 + 1);
              qVar4 = QDataBuffer<int>::size(&local_38);
              if (qVar4 <= in_stack_ffffffffffffff68) break;
              QDataBuffer<int>::at(&local_38,(long)local_60);
              indices((MonotoneToTriangles *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              QList<unsigned_short>::push_back
                        ((QList<unsigned_short> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (parameter_type)((ulong)in_stack_ffffffffffffff48 >> 0x30));
              indices((MonotoneToTriangles *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              QList<unsigned_short>::push_back
                        ((QList<unsigned_short> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (parameter_type)((ulong)in_stack_ffffffffffffff48 >> 0x30));
              QDataBuffer<int>::at(&local_38,(long)(local_60 + 1));
              indices((MonotoneToTriangles *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              QList<unsigned_short>::push_back
                        ((QList<unsigned_short> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (parameter_type)((ulong)in_stack_ffffffffffffff48 >> 0x30));
              local_60 = local_60 + 1;
            }
            piVar6 = QDataBuffer<int>::last(&local_38);
            iVar1 = *piVar6;
            piVar6 = QDataBuffer<int>::first(&local_38);
            *piVar6 = iVar1;
            QDataBuffer<int>::resize
                      ((QDataBuffer<int> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (qsizetype)in_stack_ffffffffffffff48);
          }
          else {
            while( true ) {
              qVar4 = QDataBuffer<int>::size(&local_38);
              bVar3 = false;
              if (1 < qVar4) {
                in_stack_ffffffffffffff54 = local_44;
                QDataBuffer<int>::last(&local_38);
                qVar4 = QDataBuffer<int>::size(&local_38);
                QDataBuffer<int>::at(&local_38,qVar4 + -2);
                bVar3 = leftOfEdge((MonotoneToTriangles *)
                                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                                   in_stack_ffffffffffffff74);
                bVar3 = bVar2 != (bool)((bVar3 ^ 0xffU) & 1);
              }
              if (!bVar3) break;
              QDataBuffer<int>::last(&local_38);
              indices((MonotoneToTriangles *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              QList<unsigned_short>::push_back
                        ((QList<unsigned_short> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (parameter_type)((ulong)in_stack_ffffffffffffff48 >> 0x30));
              indices((MonotoneToTriangles *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              QList<unsigned_short>::push_back
                        ((QList<unsigned_short> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (parameter_type)((ulong)in_stack_ffffffffffffff48 >> 0x30));
              qVar4 = QDataBuffer<int>::size(&local_38);
              QDataBuffer<int>::at(&local_38,qVar4 + -2);
              indices((MonotoneToTriangles *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              QList<unsigned_short>::push_back
                        ((QList<unsigned_short> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (parameter_type)((ulong)in_stack_ffffffffffffff48 >> 0x30));
              QDataBuffer<int>::pop_back(&local_38);
            }
          }
          QDataBuffer<int>::add
                    ((QDataBuffer<int> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48);
          local_44 = next(in_RDI,local_44);
          local_51 = false;
        }
      }
      in_RDI->m_first = in_RDI->m_length + 1 + in_RDI->m_first;
    }
  }
  QList<unsigned_short>::operator=
            ((QList<unsigned_short> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             &local_20);
  QDataBuffer<int>::~QDataBuffer
            ((QDataBuffer<int> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  QList<unsigned_short>::~QList((QList<unsigned_short> *)0x6868fe);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTriangulator<T>::MonotoneToTriangles::decompose()
{
    QList<T> result;
    QDataBuffer<int> stack(m_parent->m_indices.size());
    m_first = 0;
    // Require at least three more indices.
    while (m_first + 3 <= m_parent->m_indices.size()) {
        m_length = 0;
        while (m_parent->m_indices.at(m_first + m_length) != T(-1)) { // Q_TRIANGULATE_END_OF_POLYGON
            ++m_length;
            Q_ASSERT(m_first + m_length < m_parent->m_indices.size());
        }
        if (m_length < 3) {
            m_first += m_length + 1;
            continue;
        }

        int minimum = 0;
        while (less(next(minimum), minimum))
            minimum = next(minimum);
        while (less(previous(minimum), minimum))
            minimum = previous(minimum);

        stack.reset();
        stack.add(minimum);
        int left = previous(minimum);
        int right = next(minimum);
        bool stackIsOnLeftSide;
        bool clockwiseOrder = leftOfEdge(minimum, left, right);

        if (less(left, right)) {
            stack.add(left);
            left = previous(left);
            stackIsOnLeftSide = true;
        } else {
            stack.add(right);
            right = next(right);
            stackIsOnLeftSide = false;
        }

        for (int count = 0; count + 2 < m_length; ++count)
        {
            Q_ASSERT(stack.size() >= 2);
            if (less(left, right)) {
                if (stackIsOnLeftSide == false) {
                    for (int i = 0; i + 1 < stack.size(); ++i) {
                        result.push_back(indices(stack.at(i + 1)));
                        result.push_back(indices(left));
                        result.push_back(indices(stack.at(i)));
                    }
                    stack.first() = stack.last();
                    stack.resize(1);
                } else {
                    while (stack.size() >= 2 && (clockwiseOrder ^ !leftOfEdge(left, stack.at(stack.size() - 2), stack.last()))) {
                        result.push_back(indices(stack.at(stack.size() - 2)));
                        result.push_back(indices(left));
                        result.push_back(indices(stack.last()));
                        stack.pop_back();
                    }
                }
                stack.add(left);
                left = previous(left);
                stackIsOnLeftSide = true;
            } else {
                if (stackIsOnLeftSide == true) {
                    for (int i = 0; i + 1 < stack.size(); ++i) {
                        result.push_back(indices(stack.at(i)));
                        result.push_back(indices(right));
                        result.push_back(indices(stack.at(i + 1)));
                    }
                    stack.first() = stack.last();
                    stack.resize(1);
                } else {
                    while (stack.size() >= 2 && (clockwiseOrder ^ !leftOfEdge(right, stack.last(), stack.at(stack.size() - 2)))) {
                        result.push_back(indices(stack.last()));
                        result.push_back(indices(right));
                        result.push_back(indices(stack.at(stack.size() - 2)));
                        stack.pop_back();
                    }
                }
                stack.add(right);
                right = next(right);
                stackIsOnLeftSide = false;
            }
        }

        m_first += m_length + 1;
    }
    m_parent->m_indices = result;
}